

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O3

cfl_predict_hbd_fn cfl_get_predict_hbd_fn_c(TX_SIZE tx_size)

{
  undefined7 in_register_00000039;
  
  return cfl_get_predict_hbd_fn_c::pred
         [(byte)(tx_size +
                (char)((uint)(((int)CONCAT71(in_register_00000039,tx_size) +
                              (int)CONCAT71(in_register_00000039,tx_size) * 8) * 3) >> 9) * -0x13)];
}

Assistant:

static void cfl_compute_parameters(MACROBLOCKD *const xd, TX_SIZE tx_size) {
  CFL_CTX *const cfl = &xd->cfl;
  // Do not call cfl_compute_parameters multiple time on the same values.
  assert(cfl->are_parameters_computed == 0);

  cfl_pad(cfl, tx_size_wide[tx_size], tx_size_high[tx_size]);
  cfl_get_subtract_average_fn(tx_size)(cfl->recon_buf_q3, cfl->ac_buf_q3);
  cfl->are_parameters_computed = 1;
}